

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int cbs_get_two_digits(CBS *cbs,int *out)

{
  int iVar1;
  byte local_22;
  byte local_21;
  uint8_t second_digit;
  int *piStack_20;
  uint8_t first_digit;
  int *out_local;
  CBS *cbs_local;
  
  piStack_20 = out;
  out_local = (int *)cbs;
  iVar1 = CBS_get_u8(cbs,&local_21);
  if (iVar1 == 0) {
    cbs_local._4_4_ = 0;
  }
  else {
    iVar1 = OPENSSL_isdigit((uint)local_21);
    if (iVar1 == 0) {
      cbs_local._4_4_ = 0;
    }
    else {
      iVar1 = CBS_get_u8((CBS *)out_local,&local_22);
      if (iVar1 == 0) {
        cbs_local._4_4_ = 0;
      }
      else {
        iVar1 = OPENSSL_isdigit((uint)local_22);
        if (iVar1 == 0) {
          cbs_local._4_4_ = 0;
        }
        else {
          *piStack_20 = (local_21 - 0x30) * 10 + (local_22 - 0x30);
          cbs_local._4_4_ = 1;
        }
      }
    }
  }
  return cbs_local._4_4_;
}

Assistant:

static int cbs_get_two_digits(CBS *cbs, int *out) {
  uint8_t first_digit, second_digit;
  if (!CBS_get_u8(cbs, &first_digit)) {
    return 0;
  }
  if (!OPENSSL_isdigit(first_digit)) {
    return 0;
  }
  if (!CBS_get_u8(cbs, &second_digit)) {
    return 0;
  }
  if (!OPENSSL_isdigit(second_digit)) {
    return 0;
  }
  *out = (first_digit - '0') * 10 + (second_digit - '0');
  return 1;
}